

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot returnValueRegister,
          RegSlot functionRegister,ArgSlot givenArgCount,AsmJsRetType retType)

{
  Data *this_00;
  Which WVar1;
  AsmJsRetType local_34;
  undefined1 local_2e;
  undefined1 uStack_2d;
  AsmJsRetType retType_local;
  OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if ((((DAT_0159efbd == '\0') &&
       (_uStack_2d = (short)returnValueRegister, (int)_uStack_2d == returnValueRegister)) &&
      (retType_local.which_._1_2_ = (undefined2)functionRegister, functionRegister < 0x10000)) &&
     ((local_2e = (undefined1)givenArgCount, givenArgCount < 0x100 &&
      (local_34.which_ = retType.which_, WVar1 = AsmJsRetType::which(&local_34),
      DAT_0159efbd == '\0')))) {
    retType_local.which_._3_1_ = (undefined1)WVar1;
    this_00 = &(this->super_ByteCodeWriter).m_byteCodeData;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>(this_00,op,&this->super_ByteCodeWriter,false);
    ByteCodeWriter::Data::Write(this_00,&local_2e,6);
    return true;
  }
  return false;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmCall(OpCodeAsmJs op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, AsmJsRetType retType)
    {
        OpLayoutT_AsmCall<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::template Assign<int8>(layout.ReturnType, (int8)retType.which()))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }